

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EmitPropLoad
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool skipUseBeforeDeclarationCheck)

{
  ByteCodeWriter *this_00;
  Scope *symScope;
  code *pcVar1;
  ByteCodeGenerator *pBVar2;
  FuncInfo *pFVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  ProfileId PVar7;
  OpCode OVar8;
  PropertyId PVar9;
  uint uVar10;
  RegSlot RVar11;
  ByteCodeLabel labelID;
  Scope **ppSVar12;
  undefined4 *puVar13;
  Scope *scope;
  ParseNodeVar *pPVar14;
  Type *pTVar15;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar16;
  uint32 slotId;
  FuncInfo *this_01;
  int i;
  int iVar17;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 scopeLocation;
  undefined1 local_b0 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  DynamicLoadRecord local_74;
  undefined4 *local_68;
  Scope **local_60;
  PropertyId local_54;
  ByteCodeGenerator *pBStack_50;
  PropertyId envIndex;
  Symbol *local_48;
  FuncInfo *local_40;
  RegSlot local_34;
  
  local_54 = -1;
  local_60 = &this->globalScope;
  ppSVar12 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar12 = local_60;
  }
  symScope = *ppSVar12;
  recList._40_8_ = pid;
  pBStack_50 = this;
  local_40 = funcInfo;
  local_34 = lhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x13b4,"(symScope)","symScope");
    if (!bVar4) goto LAB_00803fa7;
    *puVar13 = 0;
  }
  pBVar2 = pBStack_50;
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    EmitModuleExportAccess(pBStack_50,sym,LdModuleSlot,local_34,local_40);
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       pBStack_50->alloc;
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  local_48 = sym;
  local_68 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  this_00 = &pBVar2->m_writer;
  scopeLocation.index = 0xffffffff;
  scope = (Scope *)0x0;
  while ((scope = FindScopeForSym(pBStack_50,symScope,scope,&local_54,local_40), pFVar3 = local_40,
         scope != *local_60 &&
         (scopeLocation = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2)scope->location,
         scope != symScope))) {
    uVar6 = *(ushort *)&scope->field_0x44;
    if ((uVar6 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_68 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x13ce,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar4) goto LAB_00803fa7;
      *local_68 = 0;
      uVar6 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar6 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_68 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x13cf,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar4) goto LAB_00803fa7;
      *local_68 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord(&local_74);
    local_74.label = Js::ByteCodeWriter::DefineLabel(this_00);
    if (local_48 == (Symbol *)0x0) {
      PVar9 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar9 = Symbol::EnsurePosition(local_48,pBStack_50);
    }
    uVar10 = FuncInfo::FindOrAddReferencedPropertyId(local_40,PVar9);
    if (scope->scopeType == ScopeType_With) {
      if (local_54 == -1) {
        Js::ByteCodeWriter::BrProperty
                  (this_00,BrOnHasProperty,local_74.label,scopeLocation.instance,uVar10);
        local_74.kind = LocalWith;
        local_74.field_2 = scopeLocation;
      }
      else {
        aVar16.index = local_54 + 1;
        Js::ByteCodeWriter::BrEnvProperty
                  (this_00,BrOnHasEnvProperty,local_74.label,uVar10,aVar16.index);
        local_74.kind = EnvWith;
        local_74.field_2.index = aVar16.index;
      }
    }
    else if (local_54 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,local_74.label,uVar10);
      local_74.kind = Local;
      local_74.field_2 = scopeLocation;
    }
    else {
      aVar16.index = local_54 + 1;
      Js::ByteCodeWriter::BrEnvProperty
                (this_00,BrOnHasLocalEnvProperty,local_74.label,uVar10,aVar16.index);
      local_74.kind = Env;
      local_74.field_2.index = aVar16.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_b0,0);
    ((anon_union_4_2_6390a042_for_DynamicLoadRecord_2 *)
    ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           _vptr_ReadOnlyList +
    (long)(int)recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer
    * 0xc + 8))->index = (uint32)local_74.field_2;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_74.label,local_74.kind);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  }
  if (local_48 == (Symbol *)0x0) {
    iVar17 = *(int *)(recList._40_8_ + 0x1c);
LAB_00803a0b:
    if ((pBStack_50->flags >> 10 & 1) == 0) {
      if ((pBStack_50->flags & 4) == 0) {
        if (iVar17 < 0x186) {
          if (iVar17 == 0xba) {
            OVar8 = LdInfinity;
          }
          else {
            OVar8 = LdNaN;
            if (iVar17 != 0x105) {
LAB_00803bed:
              uVar10 = FuncInfo::FindOrAddRootObjectInlineCacheId(pFVar3,iVar17,false,false);
              Js::ByteCodeWriter::PatchableRootProperty
                        (this_00,LdRootFld,local_34,uVar10,false,false,true);
              goto LAB_00803c77;
            }
          }
        }
        else if (iVar17 == 0x186) {
          OVar8 = LdUndef;
        }
        else if ((iVar17 != 0x27a) ||
                ((OVar8 = LdChakraLib, DAT_015991f5 == '\0' && (DAT_015991f6 == '\0'))))
        goto LAB_00803bed;
        Js::ByteCodeWriter::Reg1(this_00,OVar8,local_34);
      }
      else {
        RVar11 = FuncInfo::GetEnvRegister(pFVar3);
        uVar10 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar11,iVar17,false,false);
        Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,local_34,uVar10,false,true);
      }
    }
    else if ((((pFVar3->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
            (bVar4 = FuncInfo::IsGlobalFunction(pFVar3), !bVar4)) {
      RVar11 = FuncInfo::GetEnvRegister(pFVar3);
      uVar10 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar11,iVar17,false,false);
      Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,local_34,uVar10,false,true);
    }
    else {
      uVar10 = FuncInfo::FindOrAddInlineCacheId
                         (pFVar3,pFVar3->frameDisplayRegister,iVar17,false,false);
      Js::ByteCodeWriter::ElementP(this_00,ScopedLdFld,local_34,uVar10,false,true);
    }
  }
  else if (((*(ushort *)&local_48->field_0x42 & 1) == 0) ||
          (scope->func != local_40 || skipUseBeforeDeclarationCheck)) {
    if ((*(ushort *)&local_48->field_0x42 & 8) != 0) {
      iVar17 = Symbol::EnsurePosition(local_48,pBStack_50);
      goto LAB_00803a0b;
    }
    bVar4 = Symbol::IsInSlot(local_48,pBStack_50,local_40,false);
    pFVar3 = local_40;
    if (bVar4 || local_54 != -1) {
      PVar9 = Symbol::EnsureScopeSlot(local_48,pBStack_50,local_40);
      this_01 = pFVar3;
      PVar7 = FuncInfo::FindOrAddSlotProfileId(pFVar3,scope,PVar9);
      local_60 = (Scope **)CONCAT62(local_60._2_6_,PVar7);
      bVar4 = NeedCheckBlockVar((ByteCodeGenerator *)this_01,local_48,scope,pFVar3);
      OVar8 = GetLdSlotOp((ByteCodeGenerator *)this_01,scope,local_54,scopeLocation.instance,pFVar3)
      ;
      slotId = PVar9 + (~*(uint *)&sym->scope->field_0x44 & 2);
      if (local_54 == -1) {
        if ((scopeLocation.index == 0xffffffff) ||
           ((scopeLocation.index != local_40->frameSlotsRegister &&
            (scopeLocation.index != local_40->frameObjRegister)))) {
          uVar10 = scope->innerScopeIndex;
          if (uVar10 != 0xffffffff) goto LAB_00803990;
          if ((scope->field_0x44 & 2) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_68 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x146d,"(scope->GetIsObject())","scope->GetIsObject()");
            if (!bVar5) {
LAB_00803fa7:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *local_68 = 0;
          }
          Js::ByteCodeWriter::Slot
                    (this_00,OVar8,local_34,scopeLocation.instance,slotId,(ProfileId)local_60);
        }
        else {
          Js::ByteCodeWriter::SlotI1(this_00,OVar8,local_34,slotId,(ProfileId)local_60);
        }
      }
      else {
        uVar10 = local_54 + 1;
LAB_00803990:
        Js::ByteCodeWriter::SlotI2(this_00,OVar8,local_34,uVar10,slotId,(ProfileId)local_60);
      }
      if (bVar4) {
        Js::ByteCodeWriter::Reg1(this_00,ChkUndecl,local_34);
      }
    }
    else {
      if (local_48->location != local_34) {
        Js::ByteCodeWriter::Reg2(this_00,Ld_A,local_34,local_48->location);
      }
      if ((((local_48->field_0x42 & 2) != 0) && ((local_48->decl->nop & ~knopName) == knopConstDecl)
          ) && (pPVar14 = ParseNode::AsParseNodeVar(local_48->decl),
               pPVar14->isSwitchStmtDecl != '\0')) {
        Js::ByteCodeWriter::Reg1(this_00,ChkUndecl,local_34);
      }
    }
  }
  else {
    bVar4 = Symbol::IsInSlot(local_48,pBStack_50,local_40,false);
    if (bVar4) {
      PVar9 = Symbol::EnsureScopeSlot(local_48,pBStack_50,local_40);
      FuncInfo::FindOrAddSlotProfileId(local_40,scope,PVar9);
    }
    EmitUseBeforeDeclarationRuntimeError(pBStack_50,local_34);
  }
LAB_00803c77:
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer != 0) {
    labelID = Js::ByteCodeWriter::DefineLabel(this_00);
    Js::ByteCodeWriter::Br(this_00,labelID);
    local_60 = (Scope **)CONCAT44(local_60._4_4_,labelID);
    iVar17 = 0;
    do {
      if (local_48 == (Symbol *)0x0) {
        PVar9 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar9 = Symbol::EnsurePosition(local_48,pBStack_50);
      }
      pTVar15 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,iVar17);
      Js::ByteCodeWriter::MarkLabel(this_00,pTVar15->label);
      pTVar15 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,iVar17);
      switch(pTVar15->kind) {
      case Local:
        pTVar15 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar17);
        uVar10 = FuncInfo::FindOrAddInlineCacheId
                           (local_40,(pTVar15->field_2).instance,PVar9,false,false);
        Js::ByteCodeWriter::ElementP(this_00,LdLocalFld_ReuseLoc,local_34,uVar10,false,true);
        goto LAB_00803ebd;
      case Env:
        RVar11 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar15 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar17);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar11,(pTVar15->field_2).index);
        uVar10 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar11,PVar9,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,local_34,RVar11,uVar10,false,true);
        break;
      case LocalWith:
        RVar11 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar15 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar17);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar11,(pTVar15->field_2).instance);
        uVar10 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar11,PVar9,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,local_34,RVar11,uVar10,false,true);
        break;
      case EnvWith:
        RVar11 = FuncInfo::AcquireTmpRegister(local_40);
        pTVar15 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,iVar17);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar11,(pTVar15->field_2).index);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar11,RVar11);
        uVar10 = FuncInfo::FindOrAddInlineCacheId(local_40,RVar11,PVar9,false,false);
        Js::ByteCodeWriter::PatchableProperty
                  (this_00,LdFld_ReuseLoc,local_34,RVar11,uVar10,false,true);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_68 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14af,"((0))","(0)");
        if (bVar4) {
          *local_68 = 0;
          goto LAB_00803ebd;
        }
        goto LAB_00803fa7;
      }
      FuncInfo::ReleaseTmpRegister(local_40,RVar11);
LAB_00803ebd:
      if (iVar17 == (int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer + -1) goto LAB_00803edd;
      Js::ByteCodeWriter::Br(this_00,(ByteCodeLabel)local_60);
      iVar17 = iVar17 + 1;
    } while( true );
  }
LAB_00803ee8:
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_
               ,recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                _vptr_ReadOnlyList,
               (long)(int)recList.
                          super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                          .alloc * 0xc);
  }
  return;
LAB_00803edd:
  Js::ByteCodeWriter::MarkLabel(this_00,(ByteCodeLabel)local_60);
  goto LAB_00803ee8;
}

Assistant:

void ByteCodeGenerator::EmitPropLoad(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool skipUseBeforeDeclarationCheck)
{
    // If sym belongs to a parent frame, get it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just copy the value to the lhsLocation.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, lhsLocation, funcInfo);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        scopeLocation = scope->GetLocation();

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo && !skipUseBeforeDeclarationCheck)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        if (skipUseBeforeDeclarationCheck)
        {
            if (lhsLocation != Js::Constants::NoRegister)
            {
                this->m_writer.Reg1(Js::OpCode::InitUndecl, lhsLocation);
            }
        }
        else
        {
            EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
        }
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, false);
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

                // Load of a symbol with unknown scope from within eval
                // Get it from the closure environment.
                this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, false);

            // Load of a symbol with unknown scope from within event handler.
            // Get it from the closure environment.
            this->m_writer.ElementP(Js::OpCode::ScopedLdFld, lhsLocation, cacheId);
        }
        else
        {
            // Special case non-writable built-ins
            // TODO: support non-writable global property in general by detecting what attribute the property have current?
            // But can't be done if we are byte code serialized, because the attribute might be different for use fields
            // next time we run. May want to catch that in the JIT.
            Js::OpCode opcode = Js::OpCode::LdRootFld;

            // These properties are non-writable
            switch (propertyId)
            {
            case Js::PropertyIds::NaN:
                opcode = Js::OpCode::LdNaN;
                break;
            case Js::PropertyIds::Infinity:
                opcode = Js::OpCode::LdInfinity;
                break;
            case Js::PropertyIds::undefined:
                opcode = Js::OpCode::LdUndef;
                break;
            case Js::PropertyIds::__chakraLibrary:
                if (CONFIG_FLAG(LdChakraLib) || CONFIG_FLAG(TestChakraLib))
                {
                    opcode = Js::OpCode::LdChakraLib;
                }
                break;
            }

            if (opcode == Js::OpCode::LdRootFld)
            {
                this->EmitPatchableRootProperty(Js::OpCode::LdRootFld, lhsLocation, propertyId, false, false, funcInfo);
            }
            else
            {
                this->Writer()->Reg1(opcode, lhsLocation);
            }
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        // Now get the property from its slot.
        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, lhsLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, lhsLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, lhsLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, lhsLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }
    else
    {
        if (lhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, lhsLocation, sym->GetLocation());
        }
        if (sym->GetIsBlockVar() && ((sym->GetDecl()->nop == knopLetDecl || sym->GetDecl()->nop == knopConstDecl) && sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl))
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, lhsLocation);
        }
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, false);
                    this->m_writer.ElementP(Js::OpCode::LdLocalFld_ReuseLoc, lhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, false);
                    this->m_writer.PatchableProperty(Js::OpCode::LdFld_ReuseLoc, lhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

}